

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O1

void x25519_ge_add(ge_p1p1 *r,ge_p3 *p,ge_cached *q)

{
  fe_loose *h;
  fe_loose *h_00;
  fe trT;
  fe trY;
  fe trZ;
  fe trX;
  fe local_d0;
  fe local_a8;
  fe local_80;
  fe local_58;
  
  fe_add(&r->X,&p->Y,&p->X);
  h = &r->Y;
  fe_sub(h,&p->Y,&p->X);
  fe_mul_impl(local_80.v,(fe_limb_t *)r,(fe_limb_t *)q);
  fe_mul_impl(local_a8.v,h->v,(q->YminusX).v);
  fe_mul_impl(local_d0.v,(q->T2d).v,(p->T).v);
  fe_mul_impl(local_58.v,(p->Z).v,(q->Z).v);
  h_00 = &r->T;
  fe_add(h_00,&local_58,&local_58);
  fe_sub(&r->X,&local_80,&local_a8);
  fe_add(h,&local_80,&local_a8);
  fe_carry(&local_80,h_00);
  fe_add(&r->Z,&local_80,&local_d0);
  fe_sub(h_00,&local_80,&local_d0);
  return;
}

Assistant:

void x25519_ge_add(ge_p1p1 *r, const ge_p3 *p, const ge_cached *q) {
  fe trX, trY, trZ, trT;

  fe_add(&r->X, &p->Y, &p->X);
  fe_sub(&r->Y, &p->Y, &p->X);
  fe_mul_tll(&trZ, &r->X, &q->YplusX);
  fe_mul_tll(&trY, &r->Y, &q->YminusX);
  fe_mul_tlt(&trT, &q->T2d, &p->T);
  fe_mul_ttl(&trX, &p->Z, &q->Z);
  fe_add(&r->T, &trX, &trX);
  fe_sub(&r->X, &trZ, &trY);
  fe_add(&r->Y, &trZ, &trY);
  fe_carry(&trZ, &r->T);
  fe_add(&r->Z, &trZ, &trT);
  fe_sub(&r->T, &trZ, &trT);
}